

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O3

void __thiscall HostVector_from_std_vector_Test::TestBody(HostVector_from_std_vector_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  AssertHelperData *pAVar5;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  allocator_type local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  void *pvStack_60;
  AssertHelperData *local_58;
  undefined8 uStack_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_58 = (AssertHelperData *)0x500000004;
  uStack_50 = 0x700000006;
  local_68 = 0x100000000;
  pvStack_60 = (void *)0x300000002;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,local_78);
  memory::
  Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
  Array<std::allocator<int>>
            ((Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_68,&local_48);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start >> 2);
  local_80.data_ = local_58;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_78,"v.size()","hv.size()",(unsigned_long *)&local_88,
             (unsigned_long *)&local_80);
  if (local_78[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pAVar1 = local_58;
  if (local_58 != (AssertHelperData *)0x0) {
    lVar4 = 0;
    pAVar5 = (AssertHelperData *)0x0;
    do {
      if (local_58 <= pAVar5) {
        __assert_fail("i<size_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                      ,0x186,
                      "reference memory::ArrayViewImpl<memory::ArrayReference<int, memory::HostCoordinator<int>>, int, memory::HostCoordinator<int>>::operator[](size_type) [R = memory::ArrayReference<int, memory::HostCoordinator<int>>, T = int, Coord = memory::HostCoordinator<int>]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_78,"v[i]","hv[i]",
                 (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4),
                 (int *)((long)pvStack_60 + lVar4));
      if (local_78[0] == (allocator_type)0x0) {
        testing::Message::Message((Message *)&local_88);
        pcVar3 = "";
        if (local_70.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_70.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                   ,0xa8,pcVar3);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_88.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_88.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pAVar5 = (AssertHelperData *)((long)&pAVar5->type + 1);
      lVar4 = lVar4 + 4;
    } while (pAVar1 != pAVar5);
  }
  if (pvStack_60 != (void *)0x0) {
    free(pvStack_60);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HostVector, from_std_vector) {
    using namespace memory;

    /*
    const std::vector<int> svec{0,1,2,3,4,5,6,7};
    const HostVector<int>::view_type v(const_cast<int*>(svec.data()), 5);
    */

    std::vector<int> v{0,1,2,3,4,5,6,7};
    HostVector<int> hv(v);

    EXPECT_EQ(v.size(), hv.size());
    for(auto i : hv.range()) {
        EXPECT_EQ(v[i], hv[i]);
    }
}